

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_entry_fread(zip_t *zip,char *filename)

{
  mz_uint file_index;
  mz_bool mVar1;
  int iVar2;
  mz_zip_archive_file_stat info;
  
  iVar2 = -1;
  if (((((zip != (zip_t *)0x0) &&
        (memset(&info,0,0x248), (zip->archive).m_zip_mode == MZ_ZIP_MODE_READING)) &&
       (file_index = (zip->entry).index, -1 < (int)file_index)) &&
      ((mVar1 = mz_zip_reader_is_file_a_directory(&zip->archive,file_index), mVar1 == 0 &&
       (mVar1 = mz_zip_reader_extract_to_file(&zip->archive,file_index,filename,0), mVar1 != 0))))
     && (mVar1 = mz_zip_reader_file_stat(&zip->archive,file_index,&info), mVar1 != 0)) {
    if ((0xffff < info.m_external_attr) &&
       (iVar2 = chmod(filename,info.m_external_attr >> 0x10), iVar2 < 0)) {
      return -1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int zip_entry_fread(struct zip_t *zip, const char *filename) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
#if defined(_MSC_VER)
#else
  mz_uint32 xattr = 0;
#endif
  mz_zip_archive_file_stat info;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));
  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING || zip->entry.index < 0) {
    // the entry is not found or we do not have read access
    return -1;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return -1;
  }

  if (!mz_zip_reader_extract_to_file(pzip, idx, filename, 0)) {
    return -1;
  }

#if defined(_MSC_VER)
#else
  if (!mz_zip_reader_file_stat(pzip, idx, &info)) {
    // Cannot get information about zip archive;
    return -1;
  }

  xattr = (info.m_external_attr >> 16) & 0xFFFF;
  if (xattr > 0) {
    if (chmod(filename, (mode_t)xattr) < 0) {
      return -1;
    }
  }
#endif

  return 0;
}